

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void randomize_buffer(u32 *seed,u8 *buffer,u32 size)

{
  u32 uVar1;
  
  for (; 3 < size; size = size - 4) {
    uVar1 = random_u32(seed);
    *(u32 *)buffer = uVar1;
    buffer = (u8 *)((long)buffer + 4);
  }
  if (size != 0) {
    uVar1 = random_u32(seed);
    *buffer = (char)uVar1;
  }
  return;
}

Assistant:

static void randomize_buffer(u32* seed, u8* buffer, u32 size) {
  while (size >= sizeof(u32)) {
    u32 x = random_u32(seed);
    memcpy(buffer, &x, sizeof(x));
    buffer += sizeof(u32);
    size -= sizeof(u32);
  }
  if (size > 0) {
    u32 x = random_u32(seed);
    switch (size) {
      case 3: *buffer++ = x & 0xff; x >>= 8; break;
      case 2: *buffer++ = x & 0xff; x >>= 8; break;
      case 1: *buffer++ = x & 0xff; x >>= 8; break;
    }
  }
}